

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t zeGetKernelProcAddrTable(ze_api_version_t version,ze_kernel_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_kernel_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      DAT_001896a8 = pDdiTable->pfnCreate;
      DAT_001896b0 = pDdiTable->pfnDestroy;
      pDdiTable->pfnCreate = tracing_layer::zeKernelCreate;
      pDdiTable->pfnDestroy = tracing_layer::zeKernelDestroy;
      DAT_001896b8 = pDdiTable->pfnSetCacheConfig;
      DAT_001896c0 = pDdiTable->pfnSetGroupSize;
      pDdiTable->pfnSetCacheConfig = tracing_layer::zeKernelSetCacheConfig;
      pDdiTable->pfnSetGroupSize = tracing_layer::zeKernelSetGroupSize;
      DAT_001896c8 = pDdiTable->pfnSuggestGroupSize;
      DAT_001896d0 = pDdiTable->pfnSuggestMaxCooperativeGroupCount;
      pDdiTable->pfnSuggestGroupSize = tracing_layer::zeKernelSuggestGroupSize;
      pDdiTable->pfnSuggestMaxCooperativeGroupCount =
           tracing_layer::zeKernelSuggestMaxCooperativeGroupCount;
      DAT_001896d8 = pDdiTable->pfnSetArgumentValue;
      DAT_001896e0 = pDdiTable->pfnSetIndirectAccess;
      pDdiTable->pfnSetArgumentValue = tracing_layer::zeKernelSetArgumentValue;
      pDdiTable->pfnSetIndirectAccess = tracing_layer::zeKernelSetIndirectAccess;
      DAT_001896e8 = pDdiTable->pfnGetIndirectAccess;
      DAT_001896f0 = pDdiTable->pfnGetSourceAttributes;
      pDdiTable->pfnGetIndirectAccess = tracing_layer::zeKernelGetIndirectAccess;
      pDdiTable->pfnGetSourceAttributes = tracing_layer::zeKernelGetSourceAttributes;
      DAT_001896f8 = pDdiTable->pfnGetProperties;
      DAT_00189700 = pDdiTable->pfnGetName;
      pDdiTable->pfnGetProperties = tracing_layer::zeKernelGetProperties;
      pDdiTable->pfnGetName = tracing_layer::zeKernelGetName;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.Kernel;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = tracing_layer::zeKernelCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = tracing_layer::zeKernelDestroy;

    dditable.pfnSetCacheConfig                           = pDdiTable->pfnSetCacheConfig;
    pDdiTable->pfnSetCacheConfig                         = tracing_layer::zeKernelSetCacheConfig;

    dditable.pfnSetGroupSize                             = pDdiTable->pfnSetGroupSize;
    pDdiTable->pfnSetGroupSize                           = tracing_layer::zeKernelSetGroupSize;

    dditable.pfnSuggestGroupSize                         = pDdiTable->pfnSuggestGroupSize;
    pDdiTable->pfnSuggestGroupSize                       = tracing_layer::zeKernelSuggestGroupSize;

    dditable.pfnSuggestMaxCooperativeGroupCount          = pDdiTable->pfnSuggestMaxCooperativeGroupCount;
    pDdiTable->pfnSuggestMaxCooperativeGroupCount        = tracing_layer::zeKernelSuggestMaxCooperativeGroupCount;

    dditable.pfnSetArgumentValue                         = pDdiTable->pfnSetArgumentValue;
    pDdiTable->pfnSetArgumentValue                       = tracing_layer::zeKernelSetArgumentValue;

    dditable.pfnSetIndirectAccess                        = pDdiTable->pfnSetIndirectAccess;
    pDdiTable->pfnSetIndirectAccess                      = tracing_layer::zeKernelSetIndirectAccess;

    dditable.pfnGetIndirectAccess                        = pDdiTable->pfnGetIndirectAccess;
    pDdiTable->pfnGetIndirectAccess                      = tracing_layer::zeKernelGetIndirectAccess;

    dditable.pfnGetSourceAttributes                      = pDdiTable->pfnGetSourceAttributes;
    pDdiTable->pfnGetSourceAttributes                    = tracing_layer::zeKernelGetSourceAttributes;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = tracing_layer::zeKernelGetProperties;

    dditable.pfnGetName                                  = pDdiTable->pfnGetName;
    pDdiTable->pfnGetName                                = tracing_layer::zeKernelGetName;

    return result;
}